

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowExampleAppWindowTitles(bool *param_1)

{
  char cVar1;
  uint uVar2;
  double dVar3;
  char buf [128];
  ImGuiWindowFlags in_stack_000002f4;
  bool *in_stack_000002f8;
  char *in_stack_00000300;
  ImVec2 local_b8;
  ImVec2 local_b0;
  char local_a8 [128];
  ImVec2 local_28;
  ImVec2 local_20;
  ImVec2 local_18;
  ImVec2 local_10 [2];
  
  ImVec2::ImVec2(local_10,100.0,100.0);
  ImVec2::ImVec2(&local_18,0.0,0.0);
  ImGui::SetNextWindowPos(local_10,4,&local_18);
  ImGui::Begin(in_stack_00000300,in_stack_000002f8,in_stack_000002f4);
  ImGui::Text("This is window 1.\nMy title is the same as window 2, but my identifier is unique.");
  ImGui::End();
  ImVec2::ImVec2(&local_20,100.0,200.0);
  ImVec2::ImVec2(&local_28,0.0,0.0);
  ImGui::SetNextWindowPos(&local_20,4,&local_28);
  ImGui::Begin(in_stack_00000300,in_stack_000002f8,in_stack_000002f4);
  ImGui::Text("This is window 2.\nMy title is the same as window 1, but my identifier is unique.");
  ImGui::End();
  dVar3 = ImGui::GetTime();
  cVar1 = "|/-\\"[(int)((int)(dVar3 / 0.25) & 3)];
  uVar2 = ImGui::GetFrameCount();
  sprintf(local_a8,"Animated title %c %d###AnimatedTitle",(ulong)(uint)(int)cVar1,(ulong)uVar2);
  ImVec2::ImVec2(&local_b0,100.0,300.0);
  ImVec2::ImVec2(&local_b8,0.0,0.0);
  ImGui::SetNextWindowPos(&local_b0,4,&local_b8);
  ImGui::Begin(in_stack_00000300,in_stack_000002f8,in_stack_000002f4);
  ImGui::Text("This window has a changing title.");
  ImGui::End();
  return;
}

Assistant:

static void ShowExampleAppWindowTitles(bool*)
{
    // By default, Windows are uniquely identified by their title.
    // You can use the "##" and "###" markers to manipulate the display/ID.

    // Using "##" to display same title but have unique identifier.
    ImGui::SetNextWindowPos(ImVec2(100, 100), ImGuiCond_FirstUseEver);
    ImGui::Begin("Same title as another window##1");
    ImGui::Text("This is window 1.\nMy title is the same as window 2, but my identifier is unique.");
    ImGui::End();

    ImGui::SetNextWindowPos(ImVec2(100, 200), ImGuiCond_FirstUseEver);
    ImGui::Begin("Same title as another window##2");
    ImGui::Text("This is window 2.\nMy title is the same as window 1, but my identifier is unique.");
    ImGui::End();

    // Using "###" to display a changing title but keep a static identifier "AnimatedTitle"
    char buf[128];
    sprintf(buf, "Animated title %c %d###AnimatedTitle", "|/-\\"[(int)(ImGui::GetTime() / 0.25f) & 3], ImGui::GetFrameCount());
    ImGui::SetNextWindowPos(ImVec2(100, 300), ImGuiCond_FirstUseEver);
    ImGui::Begin(buf);
    ImGui::Text("This window has a changing title.");
    ImGui::End();
}